

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateHeader
          (EnumGenerator *this,Printer *printer)

{
  string *args_1;
  pointer ppEVar1;
  bool bVar2;
  iterator iVar3;
  undefined1 prefer_single_line;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  EnumValueDescriptor *extraout_RDX;
  EnumValueDescriptor *extraout_RDX_00;
  EnumValueDescriptor *descriptor;
  AlphaNum *a;
  ulong uVar6;
  string comments;
  string local_118;
  string enum_comments;
  SourceLocation location;
  string local_70;
  string local_50;
  
  enum_comments._M_dataplus._M_p = (pointer)&enum_comments.field_2;
  enum_comments._M_string_length = 0;
  location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
  location.leading_comments._M_string_length = 0;
  location.leading_comments.field_2._M_local_buf[0] = '\0';
  paVar4 = &location.trailing_comments.field_2;
  location.trailing_comments._M_string_length = 0;
  enum_comments.field_2._M_local_buf[0] = '\0';
  location.trailing_comments.field_2._M_local_buf[0] = '\0';
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  location.trailing_comments._M_dataplus._M_p = (pointer)paVar4;
  bVar2 = EnumDescriptor::GetSourceLocation(this->descriptor_,&location);
  if (bVar2) {
    BuildCommentsString_abi_cxx11_
              (&comments,(objectivec *)&location,(SourceLocation *)0x1,SUB81(paVar4,0));
    std::__cxx11::string::operator=((string *)&enum_comments,(string *)&comments);
    std::__cxx11::string::~string((string *)&comments);
  }
  else {
    std::__cxx11::string::assign((char *)&enum_comments);
  }
  args_1 = &this->name_;
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,"#pragma mark - Enum $name$\n\n",(char (*) [5])0x3de831,args_1);
  GetOptionalDeprecatedAttribute<google::protobuf::EnumDescriptor>
            (&comments,this->descriptor_,*(FileDescriptor **)(this->descriptor_ + 0x10),true,false);
  io::Printer::
  Print<char[9],std::__cxx11::string,char[21],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
             (char (*) [9])0x42c086,&enum_comments,(char (*) [21])"deprecated_attribute",&comments,
             (char (*) [5])0x3de831,args_1);
  std::__cxx11::string::~string((string *)&comments);
  io::Printer::Indent(printer);
  if (*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) == '\x03') {
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "/**\n * Value used if any message\'s field encounters a value that is not defined\n * by this enum. The message will also have C functions to get/set the rawValue\n * of the field.\n **/\n$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n"
               ,(char (*) [5])0x3de831,args_1);
  }
  uVar6 = 0;
  while( true ) {
    ppEVar1 = (this->all_values_).
              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->all_values_).
                  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3;
    if (uVar5 <= uVar6) break;
    iVar3 = std::
            _Rb_tree<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_std::_Identity<const_google::protobuf::EnumValueDescriptor_*>,_std::less<const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ::find(&(this->alias_values_to_skip_)._M_t,ppEVar1 + uVar6);
    prefer_single_line = (undefined1)uVar5;
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header) {
      bVar2 = EnumValueDescriptor::GetSourceLocation
                        ((this->all_values_).
                         super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6],&location);
      descriptor = extraout_RDX;
      if (bVar2) {
        BuildCommentsString_abi_cxx11_
                  (&local_118,(objectivec *)&location,(SourceLocation *)0x1,(bool)prefer_single_line
                  );
        std::__cxx11::string::string
                  ((string *)&comments,local_118._M_dataplus._M_p,(allocator *)&local_50);
        std::__cxx11::string::~string((string *)&local_118);
        if (comments._M_string_length != 0) {
          if (uVar6 != 0) {
            io::Printer::Print<>(printer,"\n");
          }
          io::Printer::Print<>(printer,comments._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&comments);
        descriptor = extraout_RDX_00;
      }
      EnumValueName_abi_cxx11_
                (&local_118,
                 (objectivec *)
                 (this->all_values_).
                 super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6],descriptor);
      GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                (&local_50,
                 (this->all_values_).
                 super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6],(FileDescriptor *)0x0,true,false);
      strings::AlphaNum::AlphaNum
                ((AlphaNum *)&comments,
                 *(int *)((this->all_values_).
                          super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6] + 4));
      StrCat_abi_cxx11_(&local_70,(protobuf *)&comments,a);
      io::Printer::
      Print<char[5],std::__cxx11::string,char[21],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,"$name$$deprecated_attribute$ = $value$,\n",(char (*) [5])0x3de831,
                 &local_118,(char (*) [21])"deprecated_attribute",&local_50,(char (*) [6])0x4289cc,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_118);
    }
    uVar6 = uVar6 + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,
             "};\n\nGPBEnumDescriptor *$name$_EnumDescriptor(void);\n\n/**\n * Checks to see if the given value is defined by the enum or was not known at\n * the time this source was generated.\n **/\nBOOL $name$_IsValidValue(int32_t value);\n\n"
             ,(char (*) [5])0x3de831,args_1);
  SourceLocation::~SourceLocation(&location);
  std::__cxx11::string::~string((string *)&enum_comments);
  return;
}

Assistant:

void EnumGenerator::GenerateHeader(io::Printer* printer) {
  std::string enum_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    enum_comments = BuildCommentsString(location, true);
  } else {
    enum_comments = "";
  }

  printer->Print(
      "#pragma mark - Enum $name$\n"
      "\n",
      "name", name_);

  // Swift 5 included SE0192 "Handling Future Enum Cases"
  //   https://github.com/apple/swift-evolution/blob/master/proposals/0192-non-exhaustive-enums.md
  // Since a .proto file can get new values added to an enum at any time, they
  // are effectively "non-frozen". Even in a proto3 syntax file where there is
  // support for the unknown value, an edit to the file can always add a new
  // value moving something from unknown to known. Since Swift is now ABI
  // stable, it also means a binary could contain Swift compiled against one
  // version of the .pbobjc.h file, but finally linked against an enum with
  // more cases. So the Swift code will always have to treat ObjC Proto Enums
  // as "non-frozen". The default behavior in SE0192 is for all objc enums to
  // be "non-frozen" unless marked as otherwise, so this means this generation
  // doesn't have to bother with the `enum_extensibility` attribute, as the
  // default will be what is needed.

  printer->Print("$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
                 "comments", enum_comments,
                 "deprecated_attribute", GetOptionalDeprecatedAttribute(descriptor_, descriptor_->file()),
                 "name", name_);
  printer->Indent();

  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    // Include the unknown value.
    printer->Print(
      "/**\n"
      " * Value used if any message's field encounters a value that is not defined\n"
      " * by this enum. The message will also have C functions to get/set the rawValue\n"
      " * of the field.\n"
      " **/\n"
      "$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n",
      "name", name_);
  }
  for (int i = 0; i < all_values_.size(); i++) {
    if (alias_values_to_skip_.find(all_values_[i]) != alias_values_to_skip_.end()) {
      continue;
    }
    if (all_values_[i]->GetSourceLocation(&location)) {
      std::string comments = BuildCommentsString(location, true).c_str();
      if (comments.length() > 0) {
        if (i > 0) {
          printer->Print("\n");
        }
        printer->Print(comments.c_str());
      }
    }

    printer->Print(
        "$name$$deprecated_attribute$ = $value$,\n",
        "name", EnumValueName(all_values_[i]),
        "deprecated_attribute", GetOptionalDeprecatedAttribute(all_values_[i]),
        "value", StrCat(all_values_[i]->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n"
      "GPBEnumDescriptor *$name$_EnumDescriptor(void);\n"
      "\n"
      "/**\n"
      " * Checks to see if the given value is defined by the enum or was not known at\n"
      " * the time this source was generated.\n"
      " **/\n"
      "BOOL $name$_IsValidValue(int32_t value);\n"
      "\n",
      "name", name_);
}